

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void run_container_printf_as_uint32_array(run_container_t *cont,uint32_t base)

{
  ushort uVar1;
  uint uVar2;
  int32_t i;
  uint uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  
  if (cont->n_runs != 0) {
    uVar1 = cont->runs->value;
    uVar3 = (uint)cont->runs->length;
    printf("%u",(ulong)(uVar1 + base));
    uVar2 = uVar1 + base;
    while( true ) {
      uVar2 = uVar2 + 1;
      bVar6 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar6) break;
      printf(",%u",(ulong)uVar2);
    }
    for (lVar4 = 1; lVar4 < cont->n_runs; lVar4 = lVar4 + 1) {
      iVar5 = cont->runs[lVar4].length + 1;
      uVar2 = cont->runs[lVar4].value + base;
      while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
        printf(",%u",(ulong)uVar2);
        uVar2 = uVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void run_container_printf_as_uint32_array(const run_container_t *cont,
                                          uint32_t base) {
    if (cont->n_runs == 0) return;
    {
        uint32_t run_start = base + cont->runs[0].value;
        uint16_t le = cont->runs[0].length;
        printf("%u", run_start);
        for (uint32_t j = 1; j <= le; ++j) printf(",%u", run_start + j);
    }
    for (int32_t i = 1; i < cont->n_runs; ++i) {
        uint32_t run_start = base + cont->runs[i].value;
        uint16_t le = cont->runs[i].length;
        for (uint32_t j = 0; j <= le; ++j) printf(",%u", run_start + j);
    }
}